

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowLevelIoExamples.cpp
# Opt level: O0

void writeRgbaFILE(FILE *cfile,char *fileName,Rgba *pixels,int width,int height)

{
  int iVar1;
  undefined4 in_ECX;
  ulong in_RDX;
  undefined4 in_R8D;
  RgbaOutputFile file;
  C_OStream ostr;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  C_OStream *in_stack_ffffffffffffff40;
  Vec2<float> *this;
  Vec2<float> local_a8;
  Header local_a0 [56];
  Rgba local_68 [3];
  OStream local_50 [48];
  undefined4 local_20;
  undefined4 local_1c;
  ulong local_18;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  C_OStream::C_OStream
            (in_stack_ffffffffffffff40,
             (FILE *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  this = &local_a8;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_a0,local_1c,local_20,this,0,3);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)local_68,local_50,local_a0,WRITE_RGBA,iVar1);
  Imf_3_2::Header::~Header(local_a0);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_68,local_18,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)local_68);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_68);
  C_OStream::~C_OStream((C_OStream *)0x10ab96);
  return;
}

Assistant:

void
writeRgbaFILE (
    FILE*       cfile,
    const char  fileName[],
    const Rgba* pixels,
    int         width,
    int         height)
{
    //
    // Store an RGBA image in a C stdio file that has already been opened:
    //
    //	- create a C_OStream object for writing to the file
    //	- create an RgbaOutputFile object, and attach it to the C_OStream
    //	- describe the memory layout of the pixels
    //	- store the pixels in the file
    //

    C_OStream      ostr (cfile, fileName);
    RgbaOutputFile file (ostr, Header (width, height), WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (height);
}